

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O3

int x509_rsa_ctx_to_pss(EVP_MD_CTX *ctx,X509_ALGOR *algor)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ASN1_VALUE *val;
  ASN1_INTEGER *a;
  ASN1_STRING *pAVar4;
  ASN1_OBJECT *aobj;
  int saltlen;
  ASN1_STRING *os;
  EVP_MD *sigmd;
  EVP_MD *mgf1md;
  int local_34;
  ASN1_OCTET_STRING *local_30;
  EVP_MD *local_28;
  EVP_MD *local_20;
  
  iVar1 = EVP_PKEY_CTX_get_signature_md(ctx->pctx,(EVP_MD **)&local_28);
  if (((iVar1 != 0) &&
      (iVar1 = EVP_PKEY_CTX_get_rsa_mgf1_md(ctx->pctx,(EVP_MD **)&local_20), iVar1 != 0)) &&
     (iVar1 = EVP_PKEY_CTX_get_rsa_pss_saltlen(ctx->pctx,&local_34), iVar1 != 0)) {
    if ((local_28 == local_20) && (iVar1 = EVP_MD_type(local_28), iVar1 - 0x2a0U < 3)) {
      iVar2 = EVP_MD_size(local_28);
      iVar1 = iVar2;
      if ((local_34 == -1) || (iVar1 = local_34, local_34 == iVar2)) {
        local_34 = iVar1;
        local_30 = (ASN1_STRING *)0x0;
        val = ASN1_item_new((ASN1_ITEM *)&RSA_PSS_PARAMS_it);
        iVar2 = 0;
        iVar1 = 0;
        if (val != (ASN1_VALUE *)0x0) {
          if (local_34 == 0x14) {
            __assert_fail("saltlen != 20",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                          ,0xb9,"int x509_rsa_ctx_to_pss(EVP_MD_CTX *, X509_ALGOR *)");
          }
          a = ASN1_INTEGER_new();
          *(ASN1_INTEGER **)(val + 0x10) = a;
          if ((((a != (ASN1_INTEGER *)0x0) &&
               (iVar3 = ASN1_INTEGER_set_int64((ASN1_INTEGER *)a,(long)local_34), iVar1 = iVar2,
               iVar3 != 0)) &&
              (iVar2 = rsa_md_to_algor((X509_ALGOR **)val,(EVP_MD *)local_28), iVar2 != 0)) &&
             ((iVar2 = rsa_md_to_mgf1((X509_ALGOR **)(val + 8),(EVP_MD *)local_20), iVar2 != 0 &&
              (pAVar4 = ASN1_item_pack(val,(ASN1_ITEM *)&RSA_PSS_PARAMS_it,&local_30),
              pAVar4 != (ASN1_STRING *)0x0)))) {
            aobj = OBJ_nid2obj(0x390);
            iVar2 = X509_ALGOR_set0((X509_ALGOR *)algor,aobj,0x10,local_30);
            if (iVar2 != 0) {
              local_30 = (ASN1_STRING *)0x0;
              iVar1 = 1;
            }
          }
        }
        ASN1_item_free(val,(ASN1_ITEM *)&RSA_PSS_PARAMS_it);
        ASN1_STRING_free(local_30);
        return iVar1;
      }
      iVar1 = 0xad;
    }
    else {
      iVar1 = 0xa6;
    }
    ERR_put_error(0xb,0,0x70,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/rsa_pss.cc"
                  ,iVar1);
  }
  return 0;
}

Assistant:

int x509_rsa_ctx_to_pss(EVP_MD_CTX *ctx, X509_ALGOR *algor) {
  const EVP_MD *sigmd, *mgf1md;
  int saltlen;
  if (!EVP_PKEY_CTX_get_signature_md(ctx->pctx, &sigmd) ||
      !EVP_PKEY_CTX_get_rsa_mgf1_md(ctx->pctx, &mgf1md) ||
      !EVP_PKEY_CTX_get_rsa_pss_saltlen(ctx->pctx, &saltlen)) {
    return 0;
  }

  if (sigmd != mgf1md || !is_allowed_pss_md(sigmd)) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return 0;
  }
  int md_len = (int)EVP_MD_size(sigmd);
  if (saltlen == -1) {
    saltlen = md_len;
  } else if (saltlen != md_len) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_PSS_PARAMETERS);
    return 0;
  }

  int ret = 0;
  ASN1_STRING *os = NULL;
  RSA_PSS_PARAMS *pss = RSA_PSS_PARAMS_new();
  if (!pss) {
    goto err;
  }

  // The DEFAULT value is 20, but this does not match any supported digest.
  assert(saltlen != 20);
  pss->saltLength = ASN1_INTEGER_new();
  if (!pss->saltLength ||  //
      !ASN1_INTEGER_set_int64(pss->saltLength, saltlen)) {
    goto err;
  }

  if (!rsa_md_to_algor(&pss->hashAlgorithm, sigmd) ||
      !rsa_md_to_mgf1(&pss->maskGenAlgorithm, mgf1md)) {
    goto err;
  }

  // Finally create string with pss parameter encoding.
  if (!ASN1_item_pack(pss, ASN1_ITEM_rptr(RSA_PSS_PARAMS), &os)) {
    goto err;
  }

  if (!X509_ALGOR_set0(algor, OBJ_nid2obj(NID_rsassaPss), V_ASN1_SEQUENCE,
                       os)) {
    goto err;
  }
  os = NULL;
  ret = 1;

err:
  RSA_PSS_PARAMS_free(pss);
  ASN1_STRING_free(os);
  return ret;
}